

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

void __thiscall double_conversion::StringBuilder::AddString(StringBuilder *this,char *s)

{
  StringBuilder *in_RSI;
  char *in_RDI;
  StringBuilder *this_00;
  
  this_00 = in_RSI;
  StrLength(in_RDI);
  AddSubstring(this_00,(char *)in_RSI,(int)((ulong)in_RDI >> 0x20));
  return;
}

Assistant:

void AddString(const char* s) {
    AddSubstring(s, StrLength(s));
  }